

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

field<discordpp::EmbedImage> * __thiscall
discordpp::field<discordpp::EmbedImage>::operator=
          (field<discordpp::EmbedImage> *this,field<discordpp::EmbedImage> *f)

{
  _Head_base<0UL,_discordpp::EmbedImage_*,_false> _Var1;
  _Head_base<0UL,_discordpp::EmbedImage_*,_false> this_00;
  
  _Var1._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<discordpp::EmbedImage,_std::default_delete<discordpp::EmbedImage>_>.
       _M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedImage_*,_std::default_delete<discordpp::EmbedImage>_>.
       super__Head_base<0UL,_discordpp::EmbedImage_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (EmbedImage *)0x0) {
    this_00._M_head_impl = (EmbedImage *)0x0;
  }
  else {
    this_00._M_head_impl = (EmbedImage *)operator_new(0x58);
    EmbedImage::EmbedImage(this_00._M_head_impl,_Var1._M_head_impl);
  }
  _Var1._M_head_impl =
       (this->t_)._M_t.
       super___uniq_ptr_impl<discordpp::EmbedImage,_std::default_delete<discordpp::EmbedImage>_>.
       _M_t.
       super__Tuple_impl<0UL,_discordpp::EmbedImage_*,_std::default_delete<discordpp::EmbedImage>_>.
       super__Head_base<0UL,_discordpp::EmbedImage_*,_false>._M_head_impl;
  (this->t_)._M_t.
  super___uniq_ptr_impl<discordpp::EmbedImage,_std::default_delete<discordpp::EmbedImage>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::EmbedImage_*,_std::default_delete<discordpp::EmbedImage>_>.
  super__Head_base<0UL,_discordpp::EmbedImage_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var1._M_head_impl != (EmbedImage *)0x0) {
    std::default_delete<discordpp::EmbedImage>::operator()
              ((default_delete<discordpp::EmbedImage> *)this,_Var1._M_head_impl);
  }
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }